

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O2

void __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
::nosize_transfer_element
          (table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
           *this,tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>
                 *p,ulong hash,arrays_type *arrays_,long *num_destroyed)

{
  pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>_&&,_std::shared_ptr<slang::ast::SystemSubroutine>_&&>
  local_38;
  locator local_28;
  
  *num_destroyed = *num_destroyed + 1;
  local_38.second = (shared_ptr<slang::ast::SystemSubroutine> *)(p + 1);
  local_38.first = p;
  table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SymbolKind>,std::shared_ptr<slang::ast::SystemSubroutine>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SymbolKind>,void>,std::equal_to<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SymbolKind>>,std::allocator<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SymbolKind>const,std::shared_ptr<slang::ast::SystemSubroutine>>>>
  ::
  nosize_unchecked_emplace_at<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SymbolKind>&&,std::shared_ptr<slang::ast::SystemSubroutine>&&>>
            (&local_28,
             (table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SymbolKind>,std::shared_ptr<slang::ast::SystemSubroutine>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SymbolKind>,void>,std::equal_to<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SymbolKind>>,std::allocator<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SymbolKind>const,std::shared_ptr<slang::ast::SystemSubroutine>>>>
              *)this,arrays_,hash >> ((byte)arrays_->groups_size_index & 0x3f),hash,&local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &p[1].
              super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>
              .super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>);
  return;
}

Assistant:

void nosize_transfer_element(element_type* p, std::size_t hash, const arrays_type& arrays_,
                                 std::size_t& num_destroyed, std::true_type /* ->move */) {
        /* Destroy p even if an an exception is thrown in the middle of move
         * construction, which could leave the source half-moved.
         */
        ++num_destroyed;
        destroy_element_on_exit d{this, p};
        (void)d;
        nosize_unchecked_emplace_at(arrays_, position_for(hash, arrays_), hash,
                                    type_policy::move(*p));
    }